

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorThrowFunction(JavascriptLibrary *this)

{
  JavascriptFunction *pJVar1;
  RuntimeFunction *pRVar2;
  
  pJVar1 = (this->asyncGeneratorThrowFunction).ptr;
  if (pJVar1 != (JavascriptFunction *)0x0) {
    return pJVar1;
  }
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Throw,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x16a);
  Memory::Recycler::WBSetBit((char *)&this->asyncGeneratorThrowFunction);
  (this->asyncGeneratorThrowFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->asyncGeneratorThrowFunction);
  return (this->asyncGeneratorThrowFunction).ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorThrowFunction()
    {
        if (asyncGeneratorThrowFunction == nullptr)
        {
            asyncGeneratorThrowFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Throw, 1, nullptr, nullptr, PropertyIds::throw_);
        }
        return asyncGeneratorThrowFunction;
    }